

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sm_manager.cc
# Opt level: O1

RC __thiscall
SM_Manager::CreateTable(SM_Manager *this,char *relName,int attrCount,AttrInfo *attributes)

{
  AttrType AVar1;
  ulong uVar2;
  undefined8 uVar3;
  RC RVar4;
  size_t sVar5;
  ostream *poVar6;
  iterator iVar7;
  long lVar8;
  AttrType *pAVar9;
  ulong uVar10;
  ulong uVar11;
  RC RVar12;
  int *piVar13;
  int iVar14;
  char *pcVar15;
  bool bVar16;
  AttrInfo attr;
  RID rid;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  relAttributes;
  int local_bc;
  RC local_b8;
  allocator local_a9;
  SM_Manager *local_a8;
  char *local_a0;
  ulong local_98;
  AttrInfo *local_90;
  key_type local_88;
  long local_68;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  
  uVar11 = (ulong)(uint)attrCount;
  local_a8 = this;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"CreateTable\n",0xc);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"   relName     =",0x10);
  local_a0 = relName;
  local_90 = attributes;
  if (relName == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x12c1d8);
  }
  else {
    sVar5 = strlen(relName);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,relName,sVar5);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"   attrCount   =",0x10);
  poVar6 = (ostream *)std::ostream::operator<<(&std::cout,attrCount);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
  local_98 = uVar11;
  if (0 < attrCount) {
    piVar13 = &local_90->attrLength;
    uVar10 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"   attributes[",0xe)
      ;
      poVar6 = (ostream *)std::ostream::operator<<(&std::cout,(int)uVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"].attrName=",0xb);
      pcVar15 = ((AttrInfo *)(piVar13 + -3))->attrName;
      if (pcVar15 == (char *)0x0) {
        std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
      }
      else {
        sVar5 = strlen(pcVar15);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar15,sVar5);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"   attrType=",0xc);
      AVar1 = piVar13[-1];
      pcVar15 = "INT";
      if (AVar1 != INT) {
        if (AVar1 == MBR) {
          pcVar15 = "MBR";
        }
        else {
          pcVar15 = "STRING";
          if (AVar1 == FLOAT) {
            pcVar15 = "FLOAT";
          }
        }
      }
      sVar5 = strlen(pcVar15);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar15,sVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"   attrLength=",0xe);
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,*piVar13);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
      uVar10 = uVar10 + 1;
      piVar13 = piVar13 + 4;
    } while (uVar11 != uVar10);
  }
  uVar11 = local_98;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  iVar14 = (int)local_98;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if (iVar14 - 0x29U < 0xffffffd8) {
    puts("reaches here");
    local_b8 = 0x12f;
  }
  else {
    sVar5 = strlen(local_a0);
    local_b8 = 0x12e;
    if (sVar5 < 0x19) {
      RVar12 = 0x12f;
      bVar16 = 0 < iVar14;
      if (iVar14 < 1) {
        local_bc = 0;
      }
      else {
        piVar13 = &local_90->attrLength;
        local_68 = -(uVar11 & 0xffffffff);
        local_bc = 0;
        uVar10 = 1;
        do {
          pcVar15 = ((AttrInfo *)(piVar13 + -3))->attrName;
          sVar5 = strlen(pcVar15);
          if (0x18 < sVar5) {
LAB_0010892d:
            RVar12 = 0x130;
            goto LAB_0010894d;
          }
          uVar2 = *(ulong *)(piVar13 + -1);
          if (((uVar2 != 0x400000003) && (1 < (uint)uVar2 || uVar2 >> 0x20 != 4)) &&
             (((uint)uVar2 != 2 || (0xfd < (int)(uVar2 >> 0x20) - 1U)))) goto LAB_0010892d;
          local_bc = local_bc + *piVar13;
          std::__cxx11::string::string((string *)&local_88,pcVar15,&local_a9);
          iVar7 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::find(&local_60,&local_88);
          if ((_Rb_tree_header *)iVar7._M_node != &local_60._M_impl.super__Rb_tree_header) {
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_88._M_dataplus._M_p != &local_88.field_2) {
              operator_delete(local_88._M_dataplus._M_p);
            }
            break;
          }
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&local_60,&local_88);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p != &local_88.field_2) {
            operator_delete(local_88._M_dataplus._M_p);
          }
          bVar16 = uVar10 < (uVar11 & 0xffffffff);
          piVar13 = piVar13 + 4;
          lVar8 = local_68 + uVar10;
          uVar10 = uVar10 + 1;
        } while (lVar8 != 0);
        RVar12 = 0x12f;
      }
LAB_0010894d:
      local_b8 = RVar12;
      if (!bVar16) {
        RVar4 = RM_Manager::CreateFile(local_a8->rmm,local_a0,local_bc);
        local_b8 = 0x12e;
        if (RVar4 == 0) {
          RID::RID((RID *)&local_88);
          bVar16 = 0 < (int)local_98;
          local_b8 = RVar12;
          if (0 < (int)local_98) {
            uVar10 = local_98 & 0xffffffff;
            pAVar9 = &local_90->attrType;
            uVar11 = 0;
            iVar14 = 0;
            do {
              uVar3 = *(undefined8 *)pAVar9;
              attr.attrType = (int)uVar3;
              attr.attrLength = (int)((ulong)uVar3 >> 0x20);
              attr.attrName = ((AttrInfo *)(pAVar9 + -2))->attrName;
              local_b8 = InsertAttrCat(local_a8,local_a0,attr,iVar14,(int)uVar11);
              if (local_b8 != 0) break;
              iVar14 = iVar14 + (int)((ulong)uVar3 >> 0x20);
              uVar11 = uVar11 + 1;
              bVar16 = uVar11 < uVar10;
              pAVar9 = pAVar9 + 4;
              local_b8 = RVar12;
            } while (uVar10 != uVar11);
          }
          if (((!bVar16) &&
              (local_b8 = InsertRelCat(local_a8,local_a0,(int)local_98,local_bc), local_b8 == 0)) &&
             (local_b8 = RM_FileHandle::ForcePages(&local_a8->attrcatFH,-1), local_b8 == 0)) {
            local_b8 = RM_FileHandle::ForcePages(&local_a8->relcatFH,-1);
          }
          RID::~RID((RID *)&local_88);
        }
      }
    }
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_60);
  return local_b8;
}

Assistant:

RC SM_Manager::CreateTable(const char *relName,
                           int        attrCount,
                           AttrInfo   *attributes)
{
  cout << "CreateTable\n"
    << "   relName     =" << relName << "\n"
    << "   attrCount   =" << attrCount << "\n";
  for (int i = 0; i < attrCount; i++)
    cout << "   attributes[" << i << "].attrName=" << attributes[i].attrName
        << "   attrType="
        << (attributes[i].attrType == INT ? "INT" :
            attributes[i].attrType == MBR ? "MBR" :
            attributes[i].attrType == FLOAT ? "FLOAT" : "STRING")
        << "   attrLength=" << attributes[i].attrLength << "\n";

  RC rc = 0;
  set<string> relAttributes;

  // Check for appropraite # of attributes
  if(attrCount > MAXATTRS || attrCount < 1){
    printf("reaches here\n");
    return (SM_BADREL);
  }
  if(strlen(relName) > MAXNAME) // Check for valid relName size
    return (SM_BADRELNAME);

  // Check the attribute specifications
  int totalRecSize = 0;
  for(int i = 0; i < attrCount; i++){
    if(strlen(attributes[i].attrName) > MAXNAME) // check name size
      return (SM_BADATTR);
    if(! isValidAttrType(attributes[i])) // check type
      return (SM_BADATTR);
    totalRecSize += attributes[i].attrLength; 
    string attrString(attributes[i].attrName); // check attribute dups
    bool exists = (relAttributes.find(attrString) != relAttributes.end());
    if(exists)
      return (SM_BADREL);
    else
      relAttributes.insert(attrString);
  }

  // Passed error check. Now information in relcat and attrcat

  // Create a file for this relation. This will check for duplicate tables
  // of the same name.
  if((rc = rmm.CreateFile(relName, totalRecSize)))
    return (SM_BADRELNAME);

  // For each attribute, insert into attrcat:
  RID rid;
  int currOffset = 0;
  for(int i = 0; i < attrCount; i++){
    AttrInfo attr = attributes[i];
    if((rc = InsertAttrCat(relName, attr, currOffset, i)))
      return (rc);
    currOffset += attr.attrLength;
  }
    
  // Insert into RelCat
  if((rc = InsertRelCat(relName, attrCount, totalRecSize)))
    return (rc);

  // Make sure changes to attrcat and relcat are reflected
  if((rc = attrcatFH.ForcePages()) || (rc = relcatFH.ForcePages()))
    return (rc);

  return (0);
}